

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O2

string * __thiscall
cfd::core::CfdException::GetErrorType_abi_cxx11_(string *__return_storage_ptr__,CfdException *this)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  initializer_list<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_1d2;
  less<cfd::core::CfdError> local_1d1;
  anon_enum_32 local_1d0 [10];
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  if (GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    if (iVar1 != 0) {
      local_1d0[9] = 0;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[22],_true>
                (&local_1a8,local_1d0 + 9,(char (*) [22])"successful_completion");
      local_1d0[8] = 0xffffffff;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (&local_180,local_1d0 + 8,(char (*) [14])"unknown_error");
      local_1d0[7] = 0xfffffffe;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[15],_true>
                (&local_158,local_1d0 + 7,(char (*) [15])"internal_error");
      local_1d0[6] = 0xfffffffd;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[12],_true>
                (&local_130,local_1d0 + 6,(char (*) [12])"memory_full");
      local_1d0[5] = 1;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (&local_108,local_1d0 + 5,(char (*) [17])"illegal_argument");
      local_1d0[4] = 2;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (&local_e0,local_1d0 + 4,(char (*) [14])"illegal_state");
      local_1d0[3] = 3;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[13],_true>
                (&local_b8,local_1d0 + 3,(char (*) [13])"out_of_range");
      local_1d0[2] = 4;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[16],_true>
                (&local_90,local_1d0 + 2,(char (*) [16])"invalid_setting");
      local_1d0[1] = 5;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (&local_68,local_1d0 + 1,(char (*) [17])"connection_error");
      local_1d0[0] = kCfdDiskAccessError;
      std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[18],_true>
                (&local_40,local_1d0,(char (*) [18])"disk_access_error");
      __l._M_len = 10;
      __l._M_array = &local_1a8;
      std::
      map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,__l,&local_1d1,&local_1d2);
      lVar3 = 0x170;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1a8.first + lVar3));
        lVar3 = lVar3 + -0x28;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    }
  }
  pmVar2 = std::
           map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,&this->error_code_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  return __return_storage_ptr__;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN
      _GLIBCXX_USE_NOEXCEPT {
    static const std::map<CfdError, std::string> kErrorTypeMap(
        {{kCfdSuccess, "successful_completion"},
         {kCfdUnknownError, "unknown_error"},
         {kCfdInternalError, "internal_error"},
         {kCfdMemoryFullError, "memory_full"},
         {kCfdIllegalArgumentError, "illegal_argument"},
         {kCfdIllegalStateError, "illegal_state"},
         {kCfdOutOfRangeError, "out_of_range"},
         {kCfdInvalidSettingError, "invalid_setting"},
         {kCfdConnectionError, "connection_error"},
         {kCfdDiskAccessError, "disk_access_error"}});
    return kErrorTypeMap.at(error_code_);
  }